

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

int __thiscall
vkt::shaderexecutor::ShaderCommonFunctionTests::init
          (ShaderCommonFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  ShaderSpec *this_00;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *pvVar1;
  TestContext *pTVar2;
  uint vecSize;
  DataType DVar3;
  DataType baseType;
  TestNode *pTVar4;
  CommonFunctionCase *pCVar5;
  TestNode *pTVar6;
  long lVar7;
  ulong extraout_RAX;
  ulong uVar8;
  ulong uVar9;
  int shaderTypeNdx;
  int prec;
  Precision PVar10;
  ulong in_R8;
  int shaderTypeNdx_1;
  int iVar11;
  Precision precision;
  ShaderType SVar12;
  int shaderTypeNdx_8;
  allocator<char> local_d9;
  TestNode *local_d8;
  TestNode *local_d0;
  TestNode *local_c8;
  TestNode *local_c0;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  VarType local_a0;
  string local_88;
  Symbol local_68;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"abs",
             "abs");
  local_c0 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  uVar8 = 0;
  do {
    if (uVar8 != 2) {
      if (uVar8 == 3) {
        pTVar6 = (TestNode *)operator_new(0x70);
        pTVar4 = local_c0;
        tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,local_c0->m_testCtx,"sign","sign")
        ;
        tcu::TestNode::addChild(pTVar4,pTVar6);
        uVar8 = 0;
        do {
          if (uVar8 != 2) {
            if (uVar8 == 3) {
              pTVar6 = (TestNode *)operator_new(0x70);
              pTVar4 = local_c0;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar6,local_c0->m_testCtx,"floor","floor");
              tcu::TestNode::addChild(pTVar4,pTVar6);
              uVar8 = 0;
              while (uVar8 != 3) {
                local_a8 = uVar8;
                if (1 < (int)uVar8 - 1U) {
                  local_b8 = (ulong)((&DAT_009cf0fc)[uVar8] - 1);
                  uVar8 = 1;
                  while ((int)uVar8 != 5) {
                    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)local_b8 + (int)uVar8);
                    iVar11 = 1;
                    local_c8 = (TestNode *)uVar8;
                    while (iVar11 != 3) {
                      local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,iVar11);
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d0 & 0xffffffff),
                                   (Precision)local_d8,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"floor",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00bdf9c8;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(pTVar6,(TestNode *)pCVar5);
                        in_R8 = uVar8;
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      iVar11 = (Precision)local_d8 + 1;
                    }
                    uVar8 = (ulong)((int)local_c8 + 1);
                  }
                }
                uVar8 = local_a8 + 1;
              }
              pTVar6 = (TestNode *)operator_new(0x70);
              pTVar4 = local_c0;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar6,local_c0->m_testCtx,"trunc","trunc");
              tcu::TestNode::addChild(pTVar4,pTVar6);
              uVar8 = 0;
              while (uVar8 != 3) {
                local_a8 = uVar8;
                if (1 < (int)uVar8 - 1U) {
                  local_b8 = (ulong)((&DAT_009cf0fc)[uVar8] - 1);
                  uVar8 = 1;
                  while ((int)uVar8 != 5) {
                    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)local_b8 + (int)uVar8);
                    iVar11 = 1;
                    local_c8 = (TestNode *)uVar8;
                    while (iVar11 != 3) {
                      local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,iVar11);
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d0 & 0xffffffff),
                                   (Precision)local_d8,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"trunc",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00bdfa78;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(pTVar6,(TestNode *)pCVar5);
                        in_R8 = uVar8;
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      iVar11 = (Precision)local_d8 + 1;
                    }
                    uVar8 = (ulong)((int)local_c8 + 1);
                  }
                }
                uVar8 = local_a8 + 1;
              }
              pTVar6 = (TestNode *)operator_new(0x70);
              pTVar4 = local_c0;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar6,local_c0->m_testCtx,"round","round");
              local_c8 = pTVar6;
              tcu::TestNode::addChild(pTVar4,pTVar6);
              lVar7 = 0;
              while (lVar7 != 3) {
                local_b0 = lVar7;
                if (1 < (int)lVar7 - 1U) {
                  local_a8 = (ulong)((&DAT_009cf0fc)[lVar7] - 1);
                  uVar8 = 1;
                  while ((int)uVar8 != 5) {
                    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)local_a8 + (int)uVar8);
                    iVar11 = 1;
                    local_b8 = uVar8;
                    while (iVar11 != 3) {
                      local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,iVar11);
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d0 & 0xffffffff),
                                   (Precision)local_d8,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"round",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00bdfb28;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(local_c8,(TestNode *)pCVar5);
                        in_R8 = uVar8;
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      iVar11 = (Precision)local_d8 + 1;
                    }
                    uVar8 = (ulong)((int)local_b8 + 1);
                  }
                }
                lVar7 = local_b0 + 1;
              }
              pTVar6 = (TestNode *)operator_new(0x70);
              pTVar4 = local_c0;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar6,local_c0->m_testCtx,"roundeven","roundeven");
              local_c8 = pTVar6;
              tcu::TestNode::addChild(pTVar4,pTVar6);
              lVar7 = 0;
              while (lVar7 != 3) {
                local_b0 = lVar7;
                if (1 < (int)lVar7 - 1U) {
                  local_a8 = (ulong)((&DAT_009cf0fc)[lVar7] - 1);
                  uVar8 = 1;
                  while ((int)uVar8 != 5) {
                    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)local_a8 + (int)uVar8);
                    iVar11 = 1;
                    local_b8 = uVar8;
                    while (iVar11 != 3) {
                      local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,iVar11);
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d0 & 0xffffffff),
                                   (Precision)local_d8,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"roundEven",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00bdfbd8;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(local_c8,(TestNode *)pCVar5);
                        in_R8 = uVar8;
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      iVar11 = (Precision)local_d8 + 1;
                    }
                    uVar8 = (ulong)((int)local_b8 + 1);
                  }
                }
                lVar7 = local_b0 + 1;
              }
              local_c8 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)local_c8,local_c0->m_testCtx,"ceil","ceil");
              tcu::TestNode::addChild(local_c0,local_c8);
              lVar7 = 0;
              while (lVar7 != 3) {
                local_b0 = lVar7;
                if (1 < (int)lVar7 - 1U) {
                  local_a8 = (ulong)((&DAT_009cf0fc)[lVar7] - 1);
                  uVar8 = 1;
                  while ((int)uVar8 != 5) {
                    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)local_a8 + (int)uVar8);
                    iVar11 = 1;
                    local_b8 = uVar8;
                    while (iVar11 != 3) {
                      local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,iVar11);
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d0 & 0xffffffff),
                                   (Precision)local_d8,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"ceil",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00bdfc88;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(local_c8,(TestNode *)pCVar5);
                        in_R8 = uVar8;
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      iVar11 = (Precision)local_d8 + 1;
                    }
                    uVar8 = (ulong)((int)local_b8 + 1);
                  }
                }
                lVar7 = local_b0 + 1;
              }
              local_d0 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)local_d0,local_c0->m_testCtx,"fract","fract");
              tcu::TestNode::addChild(local_c0,local_d0);
              for (local_a8 = 0; local_a8 != 3; local_a8 = local_a8 + 1) {
                if (1 < (int)local_a8 - 1U) {
                  local_b8 = (ulong)((&DAT_009cf0fc)[local_a8] - 1);
                  pTVar4 = (TestNode *)0x1;
                  while ((int)pTVar4 != 5) {
                    local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,(int)local_b8 + (int)pTVar4);
                    local_c8 = pTVar4;
                    for (PVar10 = PRECISION_MEDIUMP; PVar10 != PRECISION_LAST;
                        PVar10 = PVar10 + PRECISION_MEDIUMP) {
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        precision = (Precision)uVar8;
                        if (precision == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d8 & 0xffffffff),PVar10,
                                   precision,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"fract",precision);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00bdfd38;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d8,PVar10);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d8,PVar10);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(local_d0,(TestNode *)pCVar5);
                        in_R8 = uVar8;
                        uVar8 = (ulong)(precision + PRECISION_MEDIUMP);
                      }
                    }
                    pTVar4 = (TestNode *)(ulong)((int)local_c8 + 1);
                  }
                }
              }
              local_c8 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)local_c8,local_c0->m_testCtx,"modf","modf");
              tcu::TestNode::addChild(local_c0,local_c8);
              for (local_b0 = 0; local_b0 != 3; local_b0 = local_b0 + 1) {
                if (1 < (int)local_b0 - 1U) {
                  local_a8 = (ulong)((&DAT_009cf0fc)[local_b0] - 1);
                  uVar8 = 1;
                  while ((int)uVar8 != 5) {
                    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)local_a8 + (int)uVar8);
                    iVar11 = 1;
                    local_b8 = uVar8;
                    while( true ) {
                      local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,iVar11);
                      if (iVar11 == 3) break;
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d0 & 0xffffffff),
                                   (Precision)local_d8,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"modf",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00bdfde8;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        pvVar1 = &(pCVar5->m_spec).outputs;
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>(pvVar1,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out1",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>(pvVar1,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(local_c8,(TestNode *)pCVar5);
                        in_R8 = uVar8;
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      iVar11 = (Precision)local_d8 + 1;
                    }
                    uVar8 = (ulong)((int)local_b8 + 1);
                  }
                }
              }
              local_c8 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)local_c8,local_c0->m_testCtx,"isnan","isnan");
              tcu::TestNode::addChild(local_c0,local_c8);
              for (local_b0 = 0; local_b0 != 3; local_b0 = local_b0 + 1) {
                if (1 < (int)local_b0 - 1U) {
                  local_a8 = (ulong)((&DAT_009cf0fc)[local_b0] - 1);
                  for (local_b8 = 1; (int)local_b8 != 5; local_b8 = (ulong)((int)local_b8 + 1)) {
                    local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,(int)local_a8 + (int)local_b8);
                    iVar11 = 1;
                    while (local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,iVar11), iVar11 != 3) {
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d8 & 0xffffffff),
                                   (Precision)local_d0,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"isnan",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00bdfe98;
                        iVar11 = glu::getDataTypeScalarSize((Precision)local_d8);
                        DVar3 = TYPE_BOOL;
                        in_R8 = uVar8;
                        if (1 < iVar11) {
                          DVar3 = glu::getDataTypeBoolVec(iVar11);
                          in_R8 = uVar8;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d8,(Precision)local_d0);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,DVar3,PRECISION_LAST);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(local_c8,(TestNode *)pCVar5);
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      iVar11 = (Precision)local_d0 + 1;
                    }
                  }
                }
              }
              local_c8 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)local_c8,local_c0->m_testCtx,"isinf","isinf");
              tcu::TestNode::addChild(local_c0,local_c8);
              for (local_b0 = 0; local_b0 != 3; local_b0 = local_b0 + 1) {
                if (1 < (int)local_b0 - 1U) {
                  local_a8 = (ulong)((&DAT_009cf0fc)[local_b0] - 1);
                  for (local_b8 = 1; (int)local_b8 != 5; local_b8 = (ulong)((int)local_b8 + 1)) {
                    local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,(int)local_a8 + (int)local_b8);
                    iVar11 = 1;
                    while (local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,iVar11), iVar11 != 3) {
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d8 & 0xffffffff),
                                   (Precision)local_d0,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"isinf",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00bdff48;
                        iVar11 = glu::getDataTypeScalarSize((Precision)local_d8);
                        DVar3 = TYPE_BOOL;
                        in_R8 = uVar8;
                        if (1 < iVar11) {
                          DVar3 = glu::getDataTypeBoolVec(iVar11);
                          in_R8 = uVar8;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d8,(Precision)local_d0);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,DVar3,PRECISION_LAST);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(local_c8,(TestNode *)pCVar5);
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      iVar11 = (Precision)local_d0 + 1;
                    }
                  }
                }
              }
              pTVar4 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar4,local_c0->m_testCtx,"floatbitstoint",
                         "floatbitstoint");
              tcu::TestNode::addChild(local_c0,pTVar4);
              for (local_c8 = (TestNode *)0x0; local_c8 != (TestNode *)0x3;
                  local_c8 = (TestNode *)((long)local_c8 + 1)) {
                if (1 < (int)local_c8 - 1U) {
                  local_d0 = (TestNode *)(ulong)((&DAT_009cf0fc)[(long)local_c8] - 1);
                  for (local_d8 = (TestNode *)0x1; (Precision)local_d8 != 5;
                      local_d8 = (TestNode *)(ulong)((int)local_d8 + 1)) {
                    DVar3 = (int)local_d0 + (Precision)local_d8;
                    for (PVar10 = PRECISION_MEDIUMP; PVar10 != PRECISION_LAST;
                        PVar10 = PVar10 + PRECISION_MEDIUMP) {
                      uVar8 = 0;
                      while (SVar12 = (ShaderType)uVar8, SVar12 != SHADERTYPE_LAST) {
                        pTVar6 = (TestNode *)operator_new(0xf0);
                        shaderexecutor::anon_unknown_0::FloatBitsToUintIntCase::
                        FloatBitsToUintIntCase
                                  ((FloatBitsToUintIntCase *)pTVar6,local_c0->m_testCtx,DVar3,PVar10
                                   ,SVar12,true);
                        pTVar6->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_00bdfff8;
                        tcu::TestNode::addChild(pTVar4,pTVar6);
                        in_R8 = uVar8;
                        uVar8 = (ulong)(SVar12 + SHADERTYPE_FRAGMENT);
                      }
                    }
                  }
                }
              }
              pTVar4 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar4,local_c0->m_testCtx,"floatbitstouint",
                         "floatbitstouint");
              tcu::TestNode::addChild(local_c0,pTVar4);
              for (local_c8 = (TestNode *)0x0; local_c8 != (TestNode *)0x3;
                  local_c8 = (TestNode *)((long)local_c8 + 1)) {
                if (1 < (int)local_c8 - 1U) {
                  local_d0 = (TestNode *)(ulong)((&DAT_009cf0fc)[(long)local_c8] - 1);
                  for (local_d8 = (TestNode *)0x1; (Precision)local_d8 != 5;
                      local_d8 = (TestNode *)(ulong)((int)local_d8 + 1)) {
                    DVar3 = (int)local_d0 + (Precision)local_d8;
                    for (PVar10 = PRECISION_MEDIUMP; PVar10 != PRECISION_LAST;
                        PVar10 = PVar10 + PRECISION_MEDIUMP) {
                      uVar8 = 0;
                      while (SVar12 = (ShaderType)uVar8, SVar12 != SHADERTYPE_LAST) {
                        pTVar6 = (TestNode *)operator_new(0xf0);
                        shaderexecutor::anon_unknown_0::FloatBitsToUintIntCase::
                        FloatBitsToUintIntCase
                                  ((FloatBitsToUintIntCase *)pTVar6,local_c0->m_testCtx,DVar3,PVar10
                                   ,SVar12,false);
                        pTVar6->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_00be0108;
                        tcu::TestNode::addChild(pTVar4,pTVar6);
                        in_R8 = uVar8;
                        uVar8 = (ulong)(SVar12 + SHADERTYPE_FRAGMENT);
                      }
                    }
                  }
                }
              }
              local_c8 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)local_c8,local_c0->m_testCtx,"frexp","frexp");
              tcu::TestNode::addChild(local_c0,local_c8);
              for (local_b0 = 0; local_b0 != 3; local_b0 = local_b0 + 1) {
                if (1 < (int)local_b0 - 1U) {
                  local_a8 = (ulong)((&DAT_009cf0fc)[local_b0] - 1);
                  for (local_b8 = 1; (int)local_b8 != 5; local_b8 = (ulong)((int)local_b8 + 1)) {
                    local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,(int)local_a8 + (int)local_b8);
                    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,1);
                    while ((Precision)local_d0 != 3) {
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d8 & 0xffffffff),
                                   (Precision)local_d0,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"frexp",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00be0168;
                        iVar11 = glu::getDataTypeScalarSize((Precision)local_d8);
                        DVar3 = TYPE_INT;
                        in_R8 = uVar8;
                        if (1 < iVar11) {
                          DVar3 = glu::getDataTypeIntVec(iVar11);
                          in_R8 = uVar8;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d8,(Precision)local_d0);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d8,PRECISION_HIGHP);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        pvVar1 = &(pCVar5->m_spec).outputs;
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>(pvVar1,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out1",&local_d9);
                        glu::VarType::VarType(&local_a0,DVar3,PRECISION_HIGHP);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>(pvVar1,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(local_c8,(TestNode *)pCVar5);
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(Precision)local_d0 + 1);
                    }
                  }
                }
              }
              local_c8 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)local_c8,local_c0->m_testCtx,"ldexp","ldexp");
              tcu::TestNode::addChild(local_c0,local_c8);
              for (local_b0 = 0; local_b0 != 3; local_b0 = local_b0 + 1) {
                if (1 < (int)local_b0 - 1U) {
                  local_a8 = (ulong)((&DAT_009cf0fc)[local_b0] - 1);
                  for (local_b8 = 1; (int)local_b8 != 5; local_b8 = (ulong)((int)local_b8 + 1)) {
                    local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,(int)local_a8 + (int)local_b8);
                    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,1);
                    while ((Precision)local_d0 != 3) {
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d8 & 0xffffffff),
                                   (Precision)local_d0,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"ldexp",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00be0218;
                        iVar11 = glu::getDataTypeScalarSize((Precision)local_d8);
                        DVar3 = TYPE_INT;
                        in_R8 = uVar8;
                        if (1 < iVar11) {
                          DVar3 = glu::getDataTypeIntVec(iVar11);
                          in_R8 = uVar8;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d8,(Precision)local_d0);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"in1",&local_d9);
                        glu::VarType::VarType(&local_a0,DVar3,PRECISION_HIGHP);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"out0",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d8,PRECISION_HIGHP);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        tcu::TestNode::addChild(local_c8,(TestNode *)pCVar5);
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(Precision)local_d0 + 1);
                    }
                  }
                }
              }
              local_c8 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)local_c8,local_c0->m_testCtx,"fma","fma");
              tcu::TestNode::addChild(local_c0,local_c8);
              for (local_b0 = 0; local_b0 != 3; local_b0 = local_b0 + 1) {
                if (1 < (int)local_b0 - 1U) {
                  local_a8 = (ulong)((&DAT_009cf0fc)[local_b0] - 1);
                  for (local_b8 = 1; (int)local_b8 != 5; local_b8 = (ulong)((int)local_b8 + 1)) {
                    local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)local_a8 + (int)local_b8);
                    local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,1);
                    while ((Precision)local_d8 != 3) {
                      uVar8 = 0;
                      while( true ) {
                        SVar12 = (ShaderType)in_R8;
                        PVar10 = (Precision)uVar8;
                        if (PVar10 == 6) break;
                        pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                        pTVar2 = local_c0->m_testCtx;
                        shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                                  (&local_68.name,
                                   (_anonymous_namespace_ *)((ulong)local_d0 & 0xffffffff),
                                   (Precision)local_d8,PVar10,SVar12);
                        shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                                  (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"fma",PVar10);
                        std::__cxx11::string::~string((string *)&local_68);
                        (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                             (_func_int **)&PTR__CommonFunctionCase_00be02c8;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"a",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        this_00 = &pCVar5->m_spec;
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"b",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"c",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_88,"res",&local_d9);
                        glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                        Symbol::Symbol(&local_68,&local_88,&local_a0);
                        std::
                        vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                        ::emplace_back<vkt::shaderexecutor::Symbol>
                                  (&(pCVar5->m_spec).outputs,&local_68);
                        Symbol::~Symbol(&local_68);
                        glu::VarType::~VarType(&local_a0);
                        std::__cxx11::string::~string((string *)&local_88);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                        std::__cxx11::string::assign((char *)&(pCVar5->m_spec).globalDeclarations);
                        in_R8 = uVar8;
                        tcu::TestNode::addChild(local_c8,(TestNode *)pCVar5);
                        uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                      }
                      local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,(Precision)local_d8 + 1);
                    }
                  }
                }
              }
              local_d8 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)local_d8,local_c0->m_testCtx,"intbitstofloat",
                         "intBitsToFloat() Tests");
              pTVar6 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar6,local_c0->m_testCtx,"uintbitstofloat",
                         "uintBitsToFloat() Tests");
              pTVar4 = local_c0;
              tcu::TestNode::addChild(local_c0,local_d8);
              tcu::TestNode::addChild(pTVar4,pTVar6);
              uVar8 = 1;
              local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,1);
              while (vecSize = (Precision)local_d0, (Precision)local_d0 != 4) {
                DVar3 = TYPE_INT;
                baseType = TYPE_UINT;
                if (1 < (Precision)local_d0) {
                  DVar3 = glu::getDataTypeIntVec((Precision)local_d0);
                  baseType = glu::getDataTypeUintVec(vecSize);
                  uVar8 = (ulong)baseType;
                }
                for (SVar12 = SHADERTYPE_VERTEX; SVar12 != SHADERTYPE_LAST;
                    SVar12 = SVar12 + SHADERTYPE_FRAGMENT) {
                  if ((0x3cU >> (SVar12 & 0x1f) & 1) != 0) {
                    pTVar4 = (TestNode *)operator_new(0xf0);
                    shaderexecutor::anon_unknown_0::BitsToFloatCase::BitsToFloatCase
                              ((BitsToFloatCase *)pTVar4,local_c0->m_testCtx,DVar3,SVar12);
                    tcu::TestNode::addChild(local_d8,pTVar4);
                    pTVar4 = (TestNode *)operator_new(0xf0);
                    shaderexecutor::anon_unknown_0::BitsToFloatCase::BitsToFloatCase
                              ((BitsToFloatCase *)pTVar4,local_c0->m_testCtx,baseType,SVar12);
                    tcu::TestNode::addChild(pTVar6,pTVar4);
                    uVar8 = extraout_RAX;
                  }
                }
                local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(Precision)local_d0 + 1);
              }
              return (int)uVar8;
            }
            local_b8 = (ulong)((&DAT_009cf0fc)[uVar8] - 1);
            uVar9 = 1;
            local_a8 = uVar8;
            while (uVar8 = local_a8, (int)uVar9 != 5) {
              local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)local_b8 + (int)uVar9);
              iVar11 = 1;
              local_c8 = (TestNode *)uVar9;
              while (iVar11 != 3) {
                local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,iVar11);
                uVar8 = 0;
                while( true ) {
                  SVar12 = (ShaderType)in_R8;
                  PVar10 = (Precision)uVar8;
                  if (PVar10 == 6) break;
                  pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
                  pTVar2 = local_c0->m_testCtx;
                  shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                            (&local_68.name,(_anonymous_namespace_ *)((ulong)local_d0 & 0xffffffff),
                             (Precision)local_d8,PVar10,SVar12);
                  shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                            (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"sign",PVar10);
                  std::__cxx11::string::~string((string *)&local_68);
                  (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                       (_func_int **)&PTR__CommonFunctionCase_00bdf918;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_88,"in0",&local_d9);
                  glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                  Symbol::Symbol(&local_68,&local_88,&local_a0);
                  std::
                  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ::emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar5->m_spec).inputs,&local_68);
                  Symbol::~Symbol(&local_68);
                  glu::VarType::~VarType(&local_a0);
                  std::__cxx11::string::~string((string *)&local_88);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_88,"out0",&local_d9);
                  glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
                  Symbol::Symbol(&local_68,&local_88,&local_a0);
                  std::
                  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ::emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar5->m_spec).outputs,&local_68);
                  Symbol::~Symbol(&local_68);
                  glu::VarType::~VarType(&local_a0);
                  std::__cxx11::string::~string((string *)&local_88);
                  std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
                  tcu::TestNode::addChild(pTVar6,(TestNode *)pCVar5);
                  in_R8 = uVar8;
                  uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
                }
                iVar11 = (Precision)local_d8 + 1;
              }
              uVar9 = (ulong)((int)local_c8 + 1);
            }
          }
          uVar8 = uVar8 + 1;
        } while( true );
      }
      local_b8 = (ulong)((&DAT_009cf0fc)[uVar8] - 1);
      uVar9 = 1;
      local_a8 = uVar8;
      while (uVar8 = local_a8, (int)uVar9 != 5) {
        local_d0 = (TestNode *)CONCAT44(local_d0._4_4_,(int)local_b8 + (int)uVar9);
        iVar11 = 1;
        local_c8 = (TestNode *)uVar9;
        while (iVar11 != 3) {
          local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,iVar11);
          uVar8 = 0;
          while( true ) {
            SVar12 = (ShaderType)in_R8;
            PVar10 = (Precision)uVar8;
            if (PVar10 == 6) break;
            pCVar5 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_c0->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_68.name,(_anonymous_namespace_ *)((ulong)local_d0 & 0xffffffff),
                       (Precision)local_d8,PVar10,SVar12);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar5,pTVar2,local_68.name._M_dataplus._M_p,"abs",PVar10);
            std::__cxx11::string::~string((string *)&local_68);
            (pCVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00bdf868;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"in0",&local_d9);
            glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
            Symbol::Symbol(&local_68,&local_88,&local_a0);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar5->m_spec).inputs,&local_68);
            Symbol::~Symbol(&local_68);
            glu::VarType::~VarType(&local_a0);
            std::__cxx11::string::~string((string *)&local_88);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"out0",&local_d9)
            ;
            glu::VarType::VarType(&local_a0,(Precision)local_d0,(Precision)local_d8);
            Symbol::Symbol(&local_68,&local_88,&local_a0);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar5->m_spec).outputs,&local_68);
            Symbol::~Symbol(&local_68);
            glu::VarType::~VarType(&local_a0);
            std::__cxx11::string::~string((string *)&local_88);
            std::__cxx11::string::assign((char *)&(pCVar5->m_spec).source);
            in_R8 = uVar8;
            tcu::TestNode::addChild(pTVar4,(TestNode *)pCVar5);
            uVar8 = (ulong)(PVar10 + PRECISION_MEDIUMP);
          }
          iVar11 = (Precision)local_d8 + 1;
        }
        uVar9 = (ulong)((int)local_c8 + 1);
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void ShaderCommonFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS,
		NEW_SHADERS = TC|TE|GS|CS,
	};

	//																	Float?	Int?	Uint?	Shaders
	addFunctionCases<AbsCase>				(this,	"abs",				true,	true,	false,	ALL_SHADERS);
	addFunctionCases<SignCase>				(this,	"sign",				true,	true,	false,	ALL_SHADERS);
	addFunctionCases<FloorCase>				(this,	"floor",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<TruncCase>				(this,	"trunc",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<RoundCase>				(this,	"round",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<RoundEvenCase>			(this,	"roundeven",		true,	false,	false,	ALL_SHADERS);
	addFunctionCases<CeilCase>				(this,	"ceil",				true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FractCase>				(this,	"fract",			true,	false,	false,	ALL_SHADERS);
	// mod
	addFunctionCases<ModfCase>				(this,	"modf",				true,	false,	false,	ALL_SHADERS);
	// min
	// max
	// clamp
	// mix
	// step
	// smoothstep
	addFunctionCases<IsnanCase>				(this,	"isnan",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<IsinfCase>				(this,	"isinf",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FloatBitsToIntCase>	(this,	"floatbitstoint",	true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FloatBitsToUintCase>	(this,	"floatbitstouint",	true,	false,	false,	ALL_SHADERS);

	addFunctionCases<FrexpCase>				(this,	"frexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<LdexpCase>				(this,	"ldexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FmaCase>				(this,	"fma",				true,	false,	false,	ALL_SHADERS);

	// (u)intBitsToFloat()
	{
		const deUint32		shaderBits	= NEW_SHADERS;
		tcu::TestCaseGroup* intGroup	= new tcu::TestCaseGroup(m_testCtx, "intbitstofloat",	"intBitsToFloat() Tests");
		tcu::TestCaseGroup* uintGroup	= new tcu::TestCaseGroup(m_testCtx, "uintbitstofloat",	"uintBitsToFloat() Tests");

		addChild(intGroup);
		addChild(uintGroup);

		for (int vecSize = 1; vecSize < 4; vecSize++)
		{
			const glu::DataType		intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::DataType		uintType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;

			for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
			{
				if (shaderBits & (1<<shaderType))
				{
					intGroup->addChild(new BitsToFloatCase(getTestContext(), intType, glu::ShaderType(shaderType)));
					uintGroup->addChild(new BitsToFloatCase(getTestContext(), uintType, glu::ShaderType(shaderType)));
				}
			}
		}
	}
}